

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O2

void __thiscall Lodtalk::SpecialRuntimeObjects::createSpecialClassTable(SpecialRuntimeObjects *this)

{
  pointer ppCVar1;
  Class *pCVar2;
  Metaclass *pMVar3;
  MemoryManager *this_00;
  ClassTable *this_01;
  ulong uVar4;
  size_t i;
  
  std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::resize
            (&this->specialClassTable,0x72);
  for (uVar4 = 0; uVar4 < 0x72; uVar4 = uVar4 + 2) {
    pCVar2 = Class::basicNativeNewClass(this->context,(int)uVar4 + 1);
    (this->specialClassTable).
    super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar4] = &pCVar2->super_ClassDescription;
    pMVar3 = Metaclass::basicNativeNewMetaclass(this->context);
    (this->specialClassTable).
    super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar4 + 1] = &pMVar3->super_ClassDescription;
  }
  this_00 = VMContext::getMemoryManager(this->context);
  this_01 = MemoryManager::getClassTable(this_00);
  for (uVar4 = 0;
      ppCVar1 = (this->specialClassTable).
                super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->specialClassTable).
                            super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
      uVar4 = uVar4 + 1) {
    ClassTable::addSpecialClass(this_01,ppCVar1[uVar4],uVar4);
  }
  return;
}

Assistant:

void SpecialRuntimeObjects::createSpecialClassTable()
{
    specialClassTable.resize(SpecialClassTableSize);
    for(size_t i = 0; i < SpecialClassTableSize; i += 2)
    {
        specialClassTable[i] = Class::basicNativeNewClass(context, (unsigned int) (i + 1));
        specialClassTable[i + 1] = Metaclass::basicNativeNewMetaclass(context);
    }

    // Register the special classes in the class table.
    auto classTable = context->getMemoryManager()->getClassTable();
    for(size_t i = 0; i < specialClassTable.size(); ++i)
        classTable->addSpecialClass(specialClassTable[i], i);
}